

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetAttributesWithPropertyIndex
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  
  BVar3 = 0;
  if (index < (int)(uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                          super_DynamicTypeHandler.unusedBytes >> 1)) {
    iVar4 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
              ._vptr_DynamicTypeHandler[9])
                      (this,(((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr
                             )->super_JavascriptLibraryBase).scriptContext.ptr,(ulong)(uint)index);
    if (iVar4 != propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xf62,
                                  "(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId)"
                                  ,
                                  "this->GetPropertyId(instance->GetScriptContext(), index) == propertyId"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    *attributes = (this->attributes).ptr[index] & ObjectSlotAttr_PropertyAttributesMask;
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        if (index < this->GetPathLength())
        {
            Assert(this->GetPropertyId(instance->GetScriptContext(), index) == propertyId);
            *attributes = ObjectSlotAttributesToPropertyAttributes(this->attributes[index]);
            return true;
        }
        return false;
    }